

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_set.c
# Opt level: O3

int mpt_path_set(mpt_path *path,char *val,int len)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint8_t uVar10;
  ulong uVar11;
  
  cVar2 = path->sep;
  cVar3 = path->assign;
  if (val == (char *)0x0) {
    lVar9 = 0;
  }
  else {
    if (len < 0) {
      sVar5 = strlen(val);
      uVar7 = sVar5 + 1;
    }
    else {
      uVar7 = (ulong)(uint)len;
    }
    lVar9 = 1;
    if (uVar7 != 0) {
      uVar11 = 0;
      iVar8 = 0;
      uVar6 = 0;
      do {
        cVar4 = val[uVar6];
        if (cVar4 == cVar3) {
          iVar8 = iVar8 + 1;
          uVar7 = uVar6 + 1;
          lVar9 = 0;
          break;
        }
        uVar1 = uVar6 + 1;
        if (iVar8 != 0) {
          uVar6 = uVar11;
        }
        if (cVar4 == cVar2) {
          uVar11 = uVar6;
        }
        iVar8 = iVar8 + (uint)(cVar4 == cVar2);
        uVar6 = uVar1;
      } while (uVar7 != uVar1);
      goto LAB_0010e3b0;
    }
  }
  uVar11 = 0;
  iVar8 = 0;
  uVar7 = 0;
LAB_0010e3b0:
  mpt_path_fini(path);
  path->base = val;
  path->off = 0;
  path->len = lVar9 + uVar7;
  uVar10 = (uint8_t)uVar11;
  if (0xff < uVar11) {
    uVar10 = '\0';
  }
  path->first = uVar10;
  path->sep = cVar2;
  path->assign = cVar3;
  path->flags = '\0';
  return iVar8;
}

Assistant:

extern int mpt_path_set(MPT_STRUCT(path) *path, const char *val, int len)
{
	size_t vlen, plen = 0, first = 0, add = 1;
	int elem = 0;
	char sep, assign;
	
	sep = path->sep;
	assign = path->assign;
	
	if (!val) {
		vlen = add = 0;
	} else {
		vlen = (len < 0) ? strlen(val) + 1 : (size_t) len;
	}
	
	while (plen < vlen) {
		char curr = val[plen++];
		
		/* inline assignment */
		if (curr == assign) {
			add = 0;
			++elem;
			break;
		}
		/* separator found, save length of first part */
		if ((curr == sep) && !elem++) {
			first = plen - 1;
		}
	}
	mpt_path_fini(path);
	
	path->base = val;
	path->off  = 0;
	path->len  = plen + add;
	
	path->first  = (first > UINT8_MAX) ? 0 : first;
	path->sep    = sep;
	path->assign = assign;
	path->flags  = 0;
	
	return elem;
}